

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_produce_cleanup_param<winmd::reader::ParamSig>
               (writer *w,ParamSig *param_signature,string_view *param_name,bool out)

{
  ParamSig *pPVar1;
  bool bVar2;
  value_type *pvVar3;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  char *local_c8;
  char *format_3;
  char *local_b0;
  char *format_2;
  char *local_98;
  char *format_1;
  char *local_80;
  char *format;
  anon_class_1_0_00000001 local_69;
  anon_class_8_1_a7bfa56d local_68;
  anon_class_16_2_e77078b2 local_60;
  anon_class_24_3_e2cb8684 local_50;
  bool local_33;
  bool local_32;
  bool local_31;
  bool zero;
  bool optional;
  TypeSig *pTStack_30;
  bool clear;
  TypeSig *signature;
  string_view *psStack_20;
  bool out_local;
  string_view *param_name_local;
  ParamSig *param_signature_local;
  writer *w_local;
  
  signature._7_1_ = out;
  psStack_20 = param_name;
  param_name_local = (string_view *)param_signature;
  param_signature_local = (ParamSig *)w;
  pTStack_30 = winmd::reader::ParamSig::Type(param_signature);
  local_31 = false;
  local_32 = false;
  local_33 = false;
  pvVar3 = winmd::reader::TypeSig::Type(pTStack_30);
  local_50.out = (bool *)((long)&signature + 7);
  local_50.optional = &local_32;
  local_50.clear = &local_31;
  local_60.clear = &local_31;
  local_60.zero = &local_33;
  local_68.clear = &local_31;
  format = &local_31;
  call<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>const&,cppwinrt::write_produce_cleanup_param<winmd::reader::ParamSig>(cppwinrt::writer&,winmd::reader::ParamSig_const&,std::basic_string_view<char,std::char_traits<char>>const&,bool)::_lambda(winmd::reader::ElementType)_1_,cppwinrt::write_produce_cleanup_param<winmd::reader::ParamSig>(cppwinrt::writer&,winmd::reader::ParamSig_const&,std::basic_string_view<char,std::char_traits<char>>const&,bool)::_lambda(winmd::reader::coded_index<winmd::reader::TypeDefOrRef>const&)_1_,cppwinrt::write_produce_cleanup_param<winmd::reader::ParamSig>(cppwinrt::writer&,winmd::reader::ParamSig_const&,std::basic_string_view<char,std::char_traits<char>>const&,bool)::_lambda(winmd::reader::GenericTypeIndex_const&)_1_,cppwinrt::write_produce_cleanup_param<winmd::reader::ParamSig>(cppwinrt::writer&,winmd::reader::ParamSig_const&,std::basic_string_view<char,std::char_traits<char>>const&,bool)::_lambda(winmd::reader::GenericMethodTypeIndex)_1_,cppwinrt::write_produce_cleanup_param<winmd::reader::ParamSig>(cppwinrt::writer&,winmd::reader::ParamSig_const&,std::basic_string_view<char,std::char_traits<char>>const&,bool)::_lambda(winmd::reader::GenericTypeInstSig_const&)_1_>
            (pvVar3,&local_50,&local_60,&local_68,&local_69,(anon_class_8_1_a7bfa56d *)&format);
  bVar2 = winmd::reader::TypeSig::is_szarray(pTStack_30);
  if (bVar2) {
    bVar2 = winmd::reader::ParamSig::ByRef((ParamSig *)param_name_local);
    if (bVar2) {
      local_31 = true;
    }
    else if (((local_32 & 1U) != 0) || ((local_31 & 1U) != 0)) {
      local_31 = false;
      local_33 = true;
    }
  }
  pPVar1 = param_signature_local;
  if ((local_31 & 1U) == 0) {
    if ((local_33 & 1U) == 0) {
      if ((local_32 & 1U) != 0) {
        local_c8 = 
        "            if (%) *% = nullptr;\n            winrt::Windows::Foundation::IInspectable winrt_impl_%;\n"
        ;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_d8,
                   "            if (%) *% = nullptr;\n            winrt::Windows::Foundation::IInspectable winrt_impl_%;\n"
                  );
        writer_base<cppwinrt::writer>::
        write<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  ((writer_base<cppwinrt::writer> *)pPVar1,&local_d8,psStack_20,psStack_20,
                   psStack_20);
      }
    }
    else {
      bVar2 = winmd::reader::TypeSig::is_szarray(pTStack_30);
      pPVar1 = param_signature_local;
      if (bVar2) {
        local_98 = "            zero_abi<%>(%, __%Size);\n";
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&format_2,
                   "            zero_abi<%>(%, __%Size);\n");
        pvVar3 = winmd::reader::TypeSig::Type(pTStack_30);
        writer_base<cppwinrt::writer>::
        write<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                  ((writer_base<cppwinrt::writer> *)pPVar1,(string_view *)&format_2,pvVar3,
                   psStack_20,psStack_20);
      }
      else {
        local_b0 = "            zero_abi<%>(%);\n";
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&format_3,
                   "            zero_abi<%>(%);\n");
        pvVar3 = winmd::reader::TypeSig::Type(pTStack_30);
        writer_base<cppwinrt::writer>::
        write<std::variant<winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>,std::basic_string_view<char,std::char_traits<char>>>
                  ((writer_base<cppwinrt::writer> *)pPVar1,(string_view *)&format_3,pvVar3,
                   psStack_20);
      }
    }
  }
  else {
    local_80 = "            clear_abi(%);\n";
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&format_1,
               "            clear_abi(%);\n");
    writer_base<cppwinrt::writer>::write<std::basic_string_view<char,std::char_traits<char>>>
              ((writer_base<cppwinrt::writer> *)pPVar1,(string_view *)&format_1,psStack_20);
  }
  return;
}

Assistant:

static void write_produce_cleanup_param(writer& w, T const& param_signature, std::string_view const& param_name, bool out)
    {
        TypeSig const& signature = param_signature.Type();
        bool clear{};
        bool optional{};
        bool zero{};

        call(signature.Type(),
            [&](ElementType type)
            {
                if (out && type == ElementType::Object)
                {
                    optional = true;
                }
                else if (type == ElementType::String || type == ElementType::Object)
                {
                    clear = true;
                }
            },
            [&](coded_index<TypeDefOrRef> const& index)
            {
                assert(index.type() == TypeDefOrRef::TypeDef || index.type() == TypeDefOrRef::TypeRef);

                TypeDef type;

                if (index.type() == TypeDefOrRef::TypeDef)
                {
                    type = index.TypeDef();
                }
                else if (index.type() == TypeDefOrRef::TypeRef)
                {
                    type = find(index.TypeRef());
                }

                if (type)
                {
                    auto category = get_category(type);

                    clear = category == category::class_type || category == category::interface_type || category == category::delegate_type;
                    zero = category == category::struct_type;
                }
            },
            [&](GenericTypeIndex const&)
            {
                clear = true;
            },
            [](GenericMethodTypeIndex)
            {
                throw_invalid("Generic methods not supported.");
            },
            [&](GenericTypeInstSig const&)
            {
                clear = true;
            });

        if (signature.is_szarray())
        {
            if constexpr (std::is_same_v<RetTypeSig, T>)
            {
                clear = true;
            }
            else if (param_signature.ByRef())
            {
                clear = true;
            }
            else if (optional || clear)
            {
                clear = false;
                zero = true;
            }
        }

        if (clear)
        {
            auto format = R"(            clear_abi(%);
)";

            w.write(format, param_name);
        }
        else if (zero)
        {
            if (signature.is_szarray())
            {
                auto format = R"(            zero_abi<%>(%, __%Size);
)";

                w.write(format,
                    signature.Type(),
                    param_name,
                    param_name);
            }
            else
            {
                auto format = R"(            zero_abi<%>(%);
)";

                w.write(format,
                    signature.Type(),
                    param_name);
            }
        }
        else if (optional)
        {
            auto format = R"(            if (%) *% = nullptr;
            winrt::Windows::Foundation::IInspectable winrt_impl_%;
)";

            w.write(format, param_name, param_name, param_name);
        }
    }